

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtility.cpp
# Opt level: O2

string * __thiscall
llbuild::basic::shellEscaped_abi_cxx11_(string *__return_storage_ptr__,basic *this,StringRef string)

{
  size_t sVar1;
  StringRef string_00;
  SmallString<16U> out;
  raw_svector_ostream os;
  StringRef local_88;
  SmallVectorImpl<char> local_78;
  char local_68 [16];
  raw_svector_ostream local_58;
  
  string_00.Data = string.Data;
  local_78.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_68;
  sVar1 = 0x1000000000;
  local_78.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_78.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x10;
  llvm::raw_svector_ostream::raw_svector_ostream(&local_58,&local_78);
  string_00.Length = sVar1;
  appendShellEscapedString((basic *)&local_58,(raw_ostream *)this,string_00);
  local_88.Length =
       local_78.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff;
  local_88.Data =
       (char *)local_78.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  llvm::StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_88);
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_58);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string shellEscaped(StringRef string) {
  SmallString<16> out;
  llvm::raw_svector_ostream os(out);
  appendShellEscapedString(os, string);
  return out.str();
}